

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O2

void __thiscall QErrorMessage::done(QErrorMessage *this,int a)

{
  QErrorMessagePrivate *this_00;
  bool bVar1;
  QSet<QString> *value;
  long in_FS_OFFSET;
  QSet<QString> local_30 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QErrorMessagePrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  bVar1 = QAbstractButton::isChecked(&this_00->again->super_QAbstractButton);
  if (!bVar1) {
    if ((this_00->currentType).d.size == 0) {
      if ((this_00->currentMessage).d.size == 0) goto LAB_00494a3b;
      value = &this_00->doNotShow;
    }
    else {
      value = &this_00->doNotShowType;
    }
    QSet<QString>::insert(local_30,(QString *)value);
  }
LAB_00494a3b:
  QString::clear(&this_00->currentMessage);
  QString::clear(&this_00->currentType);
  QDialog::done(&this->super_QDialog,a);
  bVar1 = QErrorMessagePrivate::nextPending(this_00);
  if (bVar1) {
    QWidget::show((QWidget *)this);
  }
  else if ((qtMessageHandler == this) && (metFatal == true)) {
    exit(1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QErrorMessage::done(int a)
{
    Q_D(QErrorMessage);
    if (!d->again->isChecked()) {
        if (d->currentType.isEmpty()) {
            if (!d->currentMessage.isEmpty())
                d->doNotShow.insert(d->currentMessage);
        } else {
            d->doNotShowType.insert(d->currentType);
        }
    }
    d->currentMessage.clear();
    d->currentType.clear();

    QDialog::done(a);

    if (d->nextPending()) {
        show();
    } else {
        if (this == qtMessageHandler && metFatal)
            exit(1);
    }
}